

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenericTypes.hpp
# Opt level: O2

string * sdglib::str_rc(string *__return_storage_ptr__,string *sequence)

{
  ulong uVar1;
  ulong uVar2;
  char cVar3;
  ulong uVar4;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::resize((ulong)__return_storage_ptr__);
  uVar4 = sequence->_M_string_length;
  uVar2 = 0;
  uVar1 = uVar4;
  do {
    uVar1 = uVar1 - 1;
    if (uVar4 <= uVar2) {
      return __return_storage_ptr__;
    }
    cVar3 = (sequence->_M_dataplus)._M_p[uVar1];
    if (cVar3 == 'A') {
      cVar3 = 'T';
LAB_001d31bc:
      (__return_storage_ptr__->_M_dataplus)._M_p[uVar2] = cVar3;
    }
    else {
      if (cVar3 == 't') {
        cVar3 = 'a';
        goto LAB_001d31bc;
      }
      if (cVar3 == 'G') {
        cVar3 = 'C';
        goto LAB_001d31bc;
      }
      if (cVar3 == 'T') {
        cVar3 = 'A';
        goto LAB_001d31bc;
      }
      if (cVar3 == 'a') {
        cVar3 = 't';
        goto LAB_001d31bc;
      }
      if (cVar3 == 'c') {
        cVar3 = 'g';
        goto LAB_001d31bc;
      }
      if (cVar3 == 'g') {
        cVar3 = 'c';
        goto LAB_001d31bc;
      }
      if (cVar3 == 'C') {
        cVar3 = 'G';
        goto LAB_001d31bc;
      }
    }
    uVar2 = uVar2 + 1;
    uVar4 = sequence->_M_string_length;
  } while( true );
}

Assistant:

inline std::string str_rc(const std::string &sequence) {
        std::string rseq;
        rseq.resize(sequence.size());
        for (size_t i = 0, j = sequence.size() - 1; i < sequence.size(); ++i, --j) {
            switch (sequence[j]) {
                case 'A':
                    rseq[i] = 'T';
                    break;
                case 'C':
                    rseq[i] = 'G';
                    break;
                case 'G':
                    rseq[i] = 'C';
                    break;
                case 'T':
                    rseq[i] = 'A';
                    break;
                case 'a':
                    rseq[i] = 't';
                    break;
                case 'c':
                    rseq[i] = 'g';
                    break;
                case 'g':
                    rseq[i] = 'c';
                    break;
                case 't':
                    rseq[i] = 'a';
                    break;
            }
        }
        return rseq;
    }